

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  ucvector v;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    v.data = *out;
    v.size = *outsize;
    v.allocsize = v.size;
    if (expected_size != 0) {
      ucvector_resize(&v,v.size + expected_size);
      v.size = *outsize;
    }
    uVar1 = lodepng_zlib_decompressv(&v,in,insize,settings);
    *out = v.data;
    *outsize = v.size;
  }
  else {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else if (settings->max_output_size == 0) {
      uVar1 = 0x6e;
    }
    else {
      uVar1 = 0x6e - (settings->max_output_size < *outsize);
    }
  }
  return uVar1;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  unsigned error;
  if(settings->custom_zlib) {
    error = settings->custom_zlib(out, outsize, in, insize, settings);
    if(error) {
      /*the custom zlib is allowed to have its own error codes, however, we translate it to code 110*/
      error = 110;
      /*if there's a max output size, and the custom zlib returned error, then indicate that error instead*/
      if(settings->max_output_size && *outsize > settings->max_output_size) error = 109;
    }
  } else {
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
  }
  return error;
}